

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inipp.h
# Opt level: O1

void __thiscall
inipp::Ini<char>::parse(Ini<char> *this,basic_istream<char,_std::char_traits<char>_> *is)

{
  size_t *psVar1;
  element_type *peVar2;
  _Alloc_hider _Var3;
  char cVar4;
  int iVar5;
  istream *piVar6;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var7;
  _Node *p_Var8;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *this_00;
  iterator iVar9;
  ulong uVar10;
  String line;
  String variable;
  String value;
  locale loc;
  String section;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_b8;
  key_type local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  locale local_70 [8];
  char *local_68;
  key_type local_60;
  undefined1 *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_local_buf[0] = '\0';
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  std::locale::locale(local_70,"C");
  local_b8 = (list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->errors;
  do {
    while( true ) {
      do {
        do {
          cVar4 = std::ios::widen((char)*(undefined8 *)(*(long *)is + -0x18) + (char)is);
          piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)is,(string *)&local_d8,cVar4);
          _Var3._M_p = local_d8._M_dataplus._M_p;
          if (((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) != 0) {
            std::locale::~locale(local_70);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_dataplus._M_p != &local_60.field_2) {
              operator_delete(local_60._M_dataplus._M_p,
                              CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                                       local_60.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,
                              CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                                       local_d8.field_2._M_local_buf[0]) + 1);
            }
            return;
          }
          _Var7 = std::
                  __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<inipp::detail::ltrim<char>(std::__cxx11::string&,std::locale_const&)::_lambda(char)_1_>>
                            (local_d8._M_dataplus._M_p,
                             local_d8._M_dataplus._M_p + local_d8._M_string_length,local_70);
          uVar10 = (long)_Var3._M_p - (long)local_d8._M_dataplus._M_p;
          if (local_d8._M_dataplus._M_p + local_d8._M_string_length == _Var7._M_current) {
            local_d8._M_dataplus._M_p[uVar10] = '\0';
            local_d8._M_string_length = uVar10;
          }
          else {
            std::__cxx11::string::_M_erase((ulong)&local_d8,uVar10);
          }
          local_b0._M_dataplus._M_p = local_d8._M_dataplus._M_p + local_d8._M_string_length;
          local_90._M_dataplus._M_p = local_d8._M_dataplus._M_p;
          std::
          __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<inipp::detail::rtrim<char>(std::__cxx11::string&,std::locale_const&)::_lambda(char)_1_>>
                    (&local_68,&local_b0,&local_90,local_70);
          local_d8._M_string_length = (long)local_68 - (long)local_d8._M_dataplus._M_p;
          *local_68 = '\0';
        } while (local_d8._M_string_length == 0);
        _Var7 = std::
                __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<inipp::Ini<char>::parse(std::istream&)::_lambda(char)_1_>>
                          (local_d8._M_dataplus._M_p,
                           local_d8._M_dataplus._M_p + local_d8._M_string_length,this);
        _Var3._M_p = local_d8._M_dataplus._M_p;
        peVar2 = (this->format).super___shared_ptr<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        iVar5 = (*peVar2->_vptr_Format[3])(peVar2,(ulong)(uint)(int)*local_d8._M_dataplus._M_p);
      } while ((char)iVar5 != '\0');
      peVar2 = (this->format).super___shared_ptr<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      iVar5 = (**peVar2->_vptr_Format)(peVar2,(ulong)(uint)(int)*_Var3._M_p);
      if ((char)iVar5 != '\0') break;
      if ((_Var7._M_current == local_d8._M_dataplus._M_p) ||
         (_Var7._M_current == local_d8._M_dataplus._M_p + local_d8._M_string_length)) {
        p_Var8 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                 _M_create_node<std::__cxx11::string_const&>(local_b8,&local_d8);
        goto LAB_001086c6;
      }
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((string *)&local_b0,local_d8._M_dataplus._M_p,_Var7._M_current);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                ((string *)&local_90,_Var7._M_current + 1,
                 local_d8._M_dataplus._M_p + local_d8._M_string_length);
      local_68 = local_b0._M_dataplus._M_p + local_b0._M_string_length;
      local_38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_b0._M_dataplus._M_p;
      std::
      __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<inipp::detail::rtrim<char>(std::__cxx11::string&,std::locale_const&)::_lambda(char)_1_>>
                (&local_40,&local_68,&local_38,local_70);
      _Var3._M_p = local_90._M_dataplus._M_p;
      local_b0._M_string_length = (long)local_40 - (long)local_b0._M_dataplus._M_p;
      *local_40 = 0;
      _Var7 = std::
              __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<inipp::detail::ltrim<char>(std::__cxx11::string&,std::locale_const&)::_lambda(char)_1_>>
                        (local_90._M_dataplus._M_p,
                         local_90._M_dataplus._M_p + local_90._M_string_length,local_70);
      uVar10 = (long)_Var3._M_p - (long)local_90._M_dataplus._M_p;
      if (local_90._M_dataplus._M_p + local_90._M_string_length == _Var7._M_current) {
        local_90._M_dataplus._M_p[uVar10] = '\0';
        local_90._M_string_length = uVar10;
      }
      else {
        std::__cxx11::string::_M_erase((ulong)&local_90,uVar10);
      }
      this_00 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                 *)std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                   ::operator[](&this->sections,&local_60);
      iVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)this_00,&local_b0);
      if (iVar9._M_node == (_Base_ptr)(this_00 + 8)) {
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_unique<std::__cxx11::string&,std::__cxx11::string&>
                  (this_00,&local_b0,&local_90);
      }
      else {
        p_Var8 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                 _M_create_node<std::__cxx11::string_const&>(local_b8,&local_d8);
        std::__detail::_List_node_base::_M_hook(&p_Var8->super__List_node_base);
        psVar1 = &(this->errors).
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
LAB_00108758:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
    }
    peVar2 = (this->format).super___shared_ptr<inipp::Format<char>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    iVar5 = (*peVar2->_vptr_Format[1])
                      (peVar2,(ulong)(uint)(int)local_d8._M_dataplus._M_p
                                                [local_d8._M_string_length - 1]);
    if ((char)iVar5 != '\0') {
      std::__cxx11::string::substr((ulong)&local_b0,(ulong)&local_d8);
      std::__cxx11::string::operator=((string *)&local_60,(string *)&local_b0);
      goto LAB_00108758;
    }
    p_Var8 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
             _M_create_node<std::__cxx11::string_const&>(local_b8,&local_d8);
LAB_001086c6:
    std::__detail::_List_node_base::_M_hook(&p_Var8->super__List_node_base);
    psVar1 = &(this->errors).
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
  } while( true );
}

Assistant:

void parse(std::basic_istream<CharT> & is) {
		String line;
		String section;
		const std::locale loc{"C"};
		while (std::getline(is, line)) {
			detail::ltrim(line, loc);
			detail::rtrim(line, loc);
			const auto length = line.length();
			if (length > 0) {
				const auto pos = std::find_if(line.begin(), line.end(), [this](CharT ch) { return format->is_assign(ch); });
				const auto & front = line.front();
				if (format->is_comment(front)) {
				}
				else if (format->is_section_start(front)) {
					if (format->is_section_end(line.back()))
						section = line.substr(1, length - 2);
					else
						errors.push_back(line);
				}
				else if (pos != line.begin() && pos != line.end()) {
					String variable(line.begin(), pos);
					String value(pos + 1, line.end());
					detail::rtrim(variable, loc);
					detail::ltrim(value, loc);
					auto & sec = sections[section];
					if (sec.find(variable) == sec.end())
						sec.emplace(variable, value);
					else
						errors.push_back(line);
				}
				else {
					errors.push_back(line);
				}
			}
		}
	}